

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O3

IOStream * __thiscall Assimp::MemoryIOSystem::Open(MemoryIOSystem *this,char *pFile,char *pMode)

{
  IOSystem *pIVar1;
  uint8_t *puVar2;
  size_t sVar3;
  int iVar4;
  undefined4 extraout_var;
  IOStream *pIVar5;
  MemoryIOStream *local_20;
  
  iVar4 = strncmp(pFile,"$$$___magic___$$$",0x11);
  if (iVar4 == 0) {
    local_20 = (MemoryIOStream *)operator_new(0x28);
    puVar2 = this->buffer;
    sVar3 = this->length;
    (local_20->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_0080b9e8;
    local_20->buffer = puVar2;
    local_20->length = sVar3;
    local_20->pos = 0;
    local_20->own = false;
    std::vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>>::
    emplace_back<Assimp::MemoryIOStream*>
              ((vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>> *)&this->created_streams
               ,&local_20);
    pIVar5 = (this->created_streams).
             super__Vector_base<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  }
  else {
    pIVar1 = this->existing_io;
    if (pIVar1 != (IOSystem *)0x0) {
      iVar4 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,pFile,pMode);
      return (IOStream *)CONCAT44(extraout_var,iVar4);
    }
    pIVar5 = (IOStream *)0x0;
  }
  return pIVar5;
}

Assistant:

IOStream* Open(const char* pFile, const char* pMode = "rb") override {
        if ( 0 == strncmp( pFile, AI_MEMORYIO_MAGIC_FILENAME, AI_MEMORYIO_MAGIC_FILENAME_LENGTH ) ) {
            created_streams.emplace_back(new MemoryIOStream(buffer, length));
            return created_streams.back();
        }
        return existing_io ? existing_io->Open(pFile, pMode) : NULL;
    }